

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

u8 mbc3_read_ext_ram(Emulator *e,MaskedAddress addr)

{
  byte bVar1;
  u8 uVar2;
  
  uVar2 = 0xff;
  if ((e->state).memory_map_state.ext_ram_enabled != FALSE) {
    bVar1 = (e->state).memory_map_state.field_3.mbc3.rtc_reg;
    if (bVar1 < 4) {
      uVar2 = gb_read_ext_ram(e,addr);
      return uVar2;
    }
    if ((e->state).memory_map_state.field_3.mbc3.latched != FALSE) {
      switch(bVar1) {
      case 8:
        uVar2 = (e->state).memory_map_state.field_3.mbc1.byte_2000_3fff;
        break;
      case 9:
        return (e->state).memory_map_state.field_3.mbc1.byte_4000_5fff;
      case 10:
        return (e->state).memory_map_state.field_3.mbc3.hour;
      case 0xb:
        return *(u8 *)((long)&(e->state).memory_map_state.field_3 + 4);
      case 0xc:
        return (byte)((e->state).memory_map_state.field_3.mbc1.bank_mode >> 8) & 1 |
               (byte)(((e->state).memory_map_state.field_3.mbc3.rtc_halt & TRUE) << 6) |
               (byte)((e->state).memory_map_state.field_3.mbc3.day_carry << 7);
      }
    }
  }
  return uVar2;
}

Assistant:

static u8 mbc3_read_ext_ram(Emulator* e, MaskedAddress addr) {
  if (!MMAP_STATE.ext_ram_enabled) {
    return INVALID_READ_BYTE;
  }

  Mbc3* mbc3 = &MMAP_STATE.mbc3;
  if (mbc3->rtc_reg <= 3) {
    return gb_read_ext_ram(e, addr);
  }

  if (!mbc3->latched) {
    return INVALID_READ_BYTE;
  }

  u8 result = INVALID_READ_BYTE;
  switch (mbc3->rtc_reg) {
    case 8: result = mbc3->sec; break;
    case 9: result = mbc3->min; break;
    case 10: result = mbc3->hour; break;
    case 11: result = mbc3->day; break;
    case 12:
      result = PACK(mbc3->day_carry, MBC3_RTC_DAY_CARRY) |
               PACK(mbc3->rtc_halt, MBC3_RTC_HALT) |
               PACK((mbc3->day >> 8) & 1, MBC3_RTC_DAY_HI);
      break;
  }

  return result;
}